

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

string * relive::demangle(string *__return_storage_ptr__,string *s)

{
  undefined8 uVar1;
  char *pcVar2;
  bad_alloc *this;
  runtime_error *this_00;
  long lVar3;
  size_type pos;
  char *ss;
  string *psStack_18;
  int status;
  string *s_local;
  string *result;
  
  ss._4_4_ = 0;
  ss._3_1_ = 0;
  psStack_18 = s;
  s_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar1 = std::__cxx11::string::c_str();
  pcVar2 = (char *)__cxa_demangle(uVar1,0,0,(long)&ss + 4);
  if (ss._4_4_ == -1) {
    this = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this);
    __cxa_throw(this,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (ss._4_4_ == -2) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psStack_18);
  }
  else {
    if (ss._4_4_ == -3) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"__cxa_demangle returned -3");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar2);
  }
  if (pcVar2 != (char *)0x0) {
    free(pcVar2);
  }
  std::__cxx11::string::length();
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  if (*pcVar2 == '*') {
    lVar3 = std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,lVar3 - 1);
  }
  while (lVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x473fae), lVar3 != -1) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,lVar3 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string demangle(const std::string&  s)
{
    int status(0);
    std::string result;
    
    char* ss = abi::__cxa_demangle(s.c_str(), 0, 0, &status);
    
    if(status == -1) {
        throw std::bad_alloc();
    }
    else if(status == -2) {
        result = s;
    }
    else if(status == -3) {
        throw std::runtime_error("__cxa_demangle returned -3");
    }
    else {
        result = ss;
    }
    
    if(ss) {
        ::free(ss);
    }
    
    if(result[result.length()-1] == '*') {
        result.erase(result.length()-1);
    }
    std::string::size_type pos = 0;
    while((pos = result.find(", ", pos)) != std::string::npos) {
        result.erase(pos+1, 1);
    }
    
    return result;
}